

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::TailCallTableInfo::TailCallTableInfo
          (TailCallTableInfo *this,Descriptor *descriptor,MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  *pvVar1;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *this_00;
  NumToEntryTable *this_01;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *pvVar2;
  TailCallTableInfo *pTVar3;
  undefined8 *puVar4;
  __index_type _Var5;
  Utf8CheckMode UVar6;
  pointer pFVar7;
  pointer pAVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields_00;
  int32_t iVar13;
  bool bVar14;
  char cVar15;
  bool bVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  CppStringType CVar19;
  uint uVar20;
  Field *as_field;
  FieldDescriptor *pFVar21;
  long lVar22;
  optional<unsigned_int> end_group_tag;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *this_02;
  reference options;
  reference this_03;
  EnumDescriptor *enum_type;
  enable_if_t<is_constructible_v<variant_alternative_t<1UL,_variant<Empty,_Field,_NonField>_>,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field>,_variant_alternative_t<1UL,_variant<Empty,_Field,_NonField>_>_&>
  pFVar23;
  Nullable<const_char_*> failure_msg;
  uint8_t uVar24;
  TailCallTableInfo *message_options_00;
  long lVar25;
  TailCallTableInfo *pTVar26;
  ulong uVar27;
  long lVar28;
  int i;
  int iVar29;
  ulong uVar30;
  Field *this_04;
  TcParseFunction TVar31;
  TailCallTableInfo *pTVar32;
  FastFieldInfo *pFVar33;
  uint uVar34;
  long lVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_01;
  pointer in_stack_fffffffffffffae8;
  FieldDescriptor *in_stack_fffffffffffffaf0;
  Field info;
  int32_t last;
  int32_t first;
  Descriptor *local_478;
  Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo> local_470;
  FieldDescriptor *local_460;
  ulong local_458;
  NumToEntryTable *local_450;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> local_448;
  FastFieldInfo fast_fields [32];
  pointer pFVar35;
  
  ordered_fields_01.ptr_ = (pointer)ordered_fields.len_;
  message_options_00 = (TailCallTableInfo *)ordered_fields.ptr_;
  pvVar1 = &this->fast_path_fields;
  this_00 = &this->aux_entries;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar31 = kDiscardEverythingFallback;
  pFVar35 = ordered_fields_01.ptr_;
  if (((descriptor->options_->field_0)._impl_.map_entry_ == false) &&
     (TVar31 = kReflectionFallback, message_options->uses_codegen == true)) {
    iVar29 = 0;
    do {
      if (descriptor->field_count_ <= iVar29) {
        TVar31 = message_options->is_lite | kGenericFallback;
        break;
      }
      pFVar21 = Descriptor::field(descriptor,iVar29);
      iVar29 = iVar29 + 1;
    } while ((pFVar21->options_->field_0)._impl_.weak_ == false);
  }
  this_01 = &this->num_to_entry_table;
  this->fallback_function = TVar31;
  if ((descriptor->options_->field_0)._impl_.message_set_wire_format_ == true) {
    if (ordered_fields_01.ptr_ != (pointer)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)fast_fields,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x3a2,"ordered_fields.empty()");
      goto LAB_00c7cbf6;
    }
    if (message_options->uses_codegen == true) {
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._0_1_ = 'v' - message_options->is_lite;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._2_2_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._4_2_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_index = '\x02';
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                  *)pvVar1,fast_fields);
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._0_1_ = 8;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._1_1_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._2_2_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._8_8_ = 0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::AuxEntry_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>>
                  *)this_00,fast_fields);
    }
    else {
      if (message_options->is_lite == true) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)fast_fields,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x3ac,"!message_options.is_lite");
        goto LAB_00c7cbf6;
      }
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._16_8_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_index = '\x02';
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._25_7_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._0_1_ = 0x77;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._1_1_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._2_2_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._4_2_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._6_2_ = 0;
      fast_fields[0].data.
      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      .
      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ._M_u._8_8_ = 0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                  *)pvVar1,fast_fields);
    }
    this->table_size_log2 = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = message_options;
    anon_unknown_36::MakeNumToEntryTable
              ((NumToEntryTable *)fast_fields,(anon_unknown_36 *)message_options_00,
               (Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>)
               (auVar9 << 0x40));
    NumToEntryTable::operator=(this_01,(NumToEntryTable *)fast_fields);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ::~vector((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               *)((long)&fast_fields[0].data.
                         super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 + 8));
    pFVar7 = (this->field_entries).
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fields.len_ = (size_type)in_stack_fffffffffffffaf0;
    fields.ptr_ = in_stack_fffffffffffffae8;
    entries.len_ = ((long)(this->field_entries).
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7) / 0x18;
    entries.ptr_ = pFVar7;
    anon_unknown_36::GenerateFieldNames
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)fast_fields,descriptor,
               entries,(MessageOptions *)pFVar35,fields);
    this_04 = (Field *)fast_fields;
    goto LAB_00c7caf8;
  }
  lVar39 = (long)ordered_fields_01.ptr_ * 0x20;
  pTVar3 = (TailCallTableInfo *)(&message_options_00->fallback_function + lVar39);
  pTVar32 = message_options_00;
  pTVar26 = message_options_00;
  lVar38 = lVar39;
  local_478 = descriptor;
  local_450 = this_01;
  if (ordered_fields_01.ptr_ != (pointer)0x0) {
    do {
      if (lVar38 + -0x20 == 0) goto LAB_00c7bc68;
      pTVar32 = (TailCallTableInfo *)&pTVar26->field_entries;
      lVar28 = *(long *)pTVar26;
      pvVar2 = &pTVar26->field_entries;
      pTVar26 = pTVar32;
      lVar38 = lVar38 + -0x20;
    } while (*(int *)(lVar28 + 4) <=
             *(int *)((long)&((pvVar2->
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                              )._M_impl.super__Vector_impl_data._M_start)->field + 4));
  }
  if (pTVar32 != pTVar3) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)fast_fields,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x3bf,
               "std::is_sorted(ordered_fields.begin(), ordered_fields.end(), [](const auto& lhs, const auto& rhs) { return lhs.field->number() < rhs.field->number(); })"
              );
LAB_00c7cbf6:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)fast_fields);
  }
LAB_00c7bc68:
  lVar38 = 0x18;
  lVar28 = 0x12;
  lVar22 = 0;
  lVar36 = (long)ordered_fields_01.ptr_ >> 2;
  for (lVar25 = lVar36; pTVar32 = message_options_00, 0 < lVar25; lVar25 = lVar25 + -1) {
    if ((bool)(&message_options_00->fallback_function)[lVar28] != false) {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 - lVar22);
      goto LAB_00c7bdd0;
    }
    if (*(char *)((long)&(message_options_00->field_entries).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar28) != '\0') {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x20 - lVar22));
      goto LAB_00c7bdd0;
    }
    if (*(char *)((long)&(message_options_00->aux_entries).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar28) != '\0') {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x40 - lVar22));
      goto LAB_00c7bdd0;
    }
    if (*(char *)((long)&(message_options_00->num_to_entry_table).blocks.
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar28) != '\0') {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x60 - lVar22));
      goto LAB_00c7bdd0;
    }
    lVar22 = lVar22 + -0x80;
    lVar28 = lVar28 + 0x80;
  }
  pTVar32 = (TailCallTableInfo *)(lVar39 + lVar22 >> 5);
  pTVar26 = (TailCallTableInfo *)((long)message_options_00 - lVar22);
  if (pTVar32 == (TailCallTableInfo *)0x1) {
LAB_00c7cb4b:
    if (*(char *)((long)&(pTVar26->fast_path_fields).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 2) != '\0') goto LAB_00c7bdd0;
  }
  else {
    if (pTVar32 == (TailCallTableInfo *)0x3) {
      pTVar32 = message_options_00;
      if ((bool)(&message_options_00->fallback_function)[lVar28] == false) {
        pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x20 - lVar22));
        goto LAB_00c7cb3d;
      }
    }
    else {
      if (pTVar32 != (TailCallTableInfo *)0x2) goto LAB_00c7bdef;
LAB_00c7cb3d:
      if (*(char *)((long)&(pTVar26->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 2) == '\0') {
        pTVar26 = (TailCallTableInfo *)&pTVar26->field_entries;
        goto LAB_00c7cb4b;
      }
    }
LAB_00c7bdd0:
    if (pTVar26 != pTVar3) {
      pTVar32 = (TailCallTableInfo *)0x1;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::resize(this_00,1);
      pAVar8 = (this_00->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pAVar8->type = kInlinedStringDonatedOffset;
      (pAVar8->field_1).field = (FieldDescriptor *)0x0;
    }
  }
LAB_00c7bdef:
  lVar28 = 0x15;
  lVar25 = 0;
  for (; 0 < lVar36; lVar36 = lVar36 + -1) {
    if ((bool)(&message_options_00->fallback_function)[lVar28] != false) {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 - lVar25);
      goto LAB_00c7be77;
    }
    if (*(char *)((long)&(message_options_00->field_entries).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar28) != '\0') {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x20 - lVar25));
      goto LAB_00c7be77;
    }
    if (*(char *)((long)&(message_options_00->aux_entries).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar28) != '\0') {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x40 - lVar25));
      goto LAB_00c7be77;
    }
    if (*(char *)((long)&(message_options_00->num_to_entry_table).blocks.
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar28) != '\0') {
      pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x60 - lVar25));
      goto LAB_00c7be77;
    }
    lVar25 = lVar25 + -0x80;
    lVar28 = lVar28 + 0x80;
  }
  lVar39 = lVar39 + lVar25 >> 5;
  pTVar26 = (TailCallTableInfo *)((long)message_options_00 - lVar25);
  if (lVar39 == 1) {
LAB_00c7cb83:
    if (*(char *)((long)&(pTVar26->fast_path_fields).
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 5) != '\0') goto LAB_00c7be77;
  }
  else {
    if (lVar39 == 3) {
      pTVar32 = message_options_00;
      if ((bool)(&message_options_00->fallback_function)[lVar28] == false) {
        pTVar26 = (TailCallTableInfo *)((long)message_options_00 + (0x20 - lVar25));
        goto LAB_00c7cb75;
      }
    }
    else {
      if (lVar39 != 2) goto LAB_00c7bea7;
LAB_00c7cb75:
      if (*(char *)((long)&(pTVar26->fast_path_fields).
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 5) == '\0') {
        pTVar26 = (TailCallTableInfo *)&pTVar26->field_entries;
        goto LAB_00c7cb83;
      }
    }
LAB_00c7be77:
    if (pTVar26 != pTVar3) {
      pTVar32 = (TailCallTableInfo *)0x3;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::resize(this_00,3);
      pAVar8 = (this_00->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pAVar8[1].type = kSplitOffset;
      pAVar8[1].field_1.field = (FieldDescriptor *)0x0;
      pAVar8 = (this_00->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pAVar8[2].type = kSplitSizeof;
      pAVar8[2].field_1.field = (FieldDescriptor *)0x0;
    }
  }
LAB_00c7bea7:
  ordered_fields_01.len_ = (size_type)this_00;
  pFVar35 = ordered_fields_01.ptr_;
  BuildFieldEntries((vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                     *)fast_fields,pTVar32,(Descriptor *)message_options,
                    (MessageOptions *)message_options_00,ordered_fields_01,
                    (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     *)in_stack_fffffffffffffae8);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::_M_move_assign(&this->field_entries,fast_fields);
  std::
  _Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::~_Vector_base((_Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                   *)fast_fields);
  end_group_tag = GetEndGroupTag(local_478);
  do {
    *(undefined1 *)
     ((long)&fast_fields[0].data.
             super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
             .
             super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
             .
             super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
             .
             super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
             .
             super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
     + lVar38) = 0;
    lVar38 = lVar38 + 0x20;
  } while (lVar38 != 0x418);
  uVar17 = FastParseTableSize((size_t)ordered_fields_01.ptr_,end_group_tag);
  local_458 = (ulong)uVar17;
  uVar37 = 0;
  local_470.ptr_ = fast_fields;
  local_470.len_ = local_458;
  local_448.ptr_ = (pointer)message_options_00;
  local_448.len_ = (size_type)ordered_fields_01.ptr_;
  if (((ulong)end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> & 0x1ffffc000) == 0x100000000) {
    uVar17 = TcParseTableBase::RecodeTagForFastParsing
                       (end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload);
    uVar18 = TcParseTableBase::TagToIdx(uVar17,(uint32_t)local_470.len_);
    this_02 = (variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
               *)absl::lts_20250127::
                 Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>::operator[]
                           (&local_470,(ulong)uVar18);
    uVar10 = info._0_8_;
    info.func = kFastEndG2 -
                (end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload < 0x80);
    info._2_2_ = (short)uVar17;
    info._6_2_ = SUB82(uVar10,6);
    info._4_2_ = end_group_tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload._0_2_;
    std::
    variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
    ::operator=(this_02,(NonField *)&info);
    uVar37 = 1 << ((byte)uVar18 & 0x1f);
  }
  lVar38 = 0;
  for (uVar30 = 0;
      pFVar7 = (this->field_entries).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar30 < (ulong)(((long)(this->field_entries).
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7) / 0x18);
      uVar30 = uVar30 + 1) {
    options = absl::lts_20250127::
              Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::operator[]
                        (&local_448,uVar30);
    pFVar21 = *(FieldDescriptor **)((long)&pFVar7->field + lVar38);
    bVar14 = IsFieldTypeEligibleForFastParsing(pFVar21);
    if (((((bVar14) && (options->is_implicitly_weak == false)) && (options->should_split == false))
        && ((bVar14 = anon_unknown_36::HasLazyRep(pFVar21,options), !bVar14 ||
            (message_options->uses_codegen == true)))) &&
       (bVar14 = anon_unknown_36::HasLazyRep(pFVar21,options),
       !bVar14 || options->lazy_opt != kTvEnum)) {
      uVar20 = (uint)*(ushort *)((long)&pFVar7->aux_idx + lVar38);
      if (((pFVar21->type_ == '\f') || (pFVar21->type_ == '\t')) &&
         (options->is_string_inlined == true)) {
        bVar14 = FieldDescriptor::is_repeated(pFVar21);
        if (bVar14) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&info,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                     ,0x124,"!field->is_repeated()");
          goto LAB_00c7cc25;
        }
        uVar20 = *(uint *)((long)&pFVar7->inlined_string_idx + lVar38);
      }
      if ((0x1f < *(int *)((long)&pFVar7->hasbit_idx + lVar38)) || (0xff < (int)uVar20))
      goto LAB_00c7c050;
      local_460 = *(FieldDescriptor **)((long)&pFVar7->field + lVar38);
      uVar17 = GetRecodedTagForFastParsing(local_460);
      uVar18 = TcParseTableBase::TagToIdx(uVar17,(uint32_t)local_470.len_);
      this_03 = absl::lts_20250127::
                Span<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>::operator[]
                          (&local_470,(ulong)uVar18);
      _Var5 = *(__index_type *)
               ((long)&(this_03->data).
                       super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
               + 0x18);
      if ((_Var5 == '\x02') ||
         ((_Var5 == '\x01' &&
          (options->presence_probability <=
           *(float *)((long)&(this_03->data).
                             super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                             .
                             super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                             .
                             super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                             .
                             super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                             .
                             super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                             .
                             super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                     + 0x14))))) goto LAB_00c7c050;
      info.func = kNone;
      info._1_7_ = 0;
      info.field = (FieldDescriptor *)0x0;
      in_stack_fffffffffffffaf0 = *(FieldDescriptor **)((long)&pFVar7->field + lVar38);
      info._16_8_ = (ulong)*(byte *)((long)&pFVar7->aux_idx + lVar38) << 0x18;
      uVar24 = in_stack_fffffffffffffaf0->type_;
      if (((uVar24 == '\f') || (uVar24 == '\t')) && (options->is_string_inlined == true)) {
        bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
        if (bVar14) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&first,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                     ,0xa6,"!field->is_repeated()");
          goto LAB_00c7cc54;
        }
        info.aux_idx = *(uint8_t *)((long)&pFVar7->inlined_string_idx + lVar38);
        uVar24 = in_stack_fffffffffffffaf0->type_;
      }
      switch(uVar24) {
      case '\x01':
      case '\x06':
      case '\x10':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '*';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '(';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '&';
          }
        }
        break;
      case '\x02':
      case '\a':
      case '\x0f':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '$';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\"';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = ' ';
          }
        }
        break;
      case '\x03':
      case '\x04':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '\x12';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x10';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x0e';
          }
        }
        break;
      case '\x05':
      case '\r':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
LAB_00c7c1ca:
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '\f';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
LAB_00c7c3f3:
          if (bVar14 == false) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\b';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\n';
          }
        }
        break;
      case '\b':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '\x06';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x04';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x02';
          }
        }
        break;
      case '\t':
        UVar6 = (&pFVar7->utf8_check_mode)[lVar38];
        if (UVar6 == kNone) {
          CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
          if (CVar19 == kCord) goto LAB_00c7c606;
          CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
          if ((CVar19 == kView) && (options->use_micro_string == true)) goto LAB_00c7c6f3;
          if (options->is_string_inlined != true) {
            bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
            goto LAB_00c7c82f;
          }
LAB_00c7c777:
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = 'P';
        }
        else if (UVar6 == kVerify) {
          CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
          if (CVar19 == kCord) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = 'X';
          }
          else {
            CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
            if ((CVar19 == kView) && (options->use_micro_string == true)) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = '^';
            }
            else if (options->is_string_inlined == true) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = 'R';
            }
            else {
              bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
              if (bVar14) {
                bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
                cVar15 = 'J';
              }
              else {
                bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
                cVar15 = 'H';
              }
            }
          }
        }
        else {
          if (UVar6 != kStrict) goto switchD_00c7c16c_default;
          CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
          if (CVar19 == kCord) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = 'Z';
          }
          else {
            CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
            if ((CVar19 == kView) && (options->use_micro_string == true)) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = '`';
            }
            else if (options->is_string_inlined == true) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = 'T';
            }
            else {
              bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
              if (bVar14) {
                bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
                cVar15 = 'N';
              }
              else {
                bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
                cVar15 = 'L';
              }
            }
          }
        }
        break;
      case '\n':
        bVar14 = options->use_direct_tcparser_table;
        bVar16 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
        iVar29 = in_stack_fffffffffffffaf0->number_;
        if (bVar14 == false) {
          if (bVar16) {
            bVar14 = iVar29 < 0x10;
            cVar15 = 'd';
          }
          else {
            bVar14 = iVar29 < 0x10;
            cVar15 = 'b';
          }
        }
        else if (bVar16) {
          bVar14 = iVar29 < 0x10;
          cVar15 = 'h';
        }
        else {
          bVar14 = iVar29 < 0x10;
          cVar15 = 'f';
        }
        break;
      case '\v':
        bVar14 = anon_unknown_36::HasLazyRep(in_stack_fffffffffffffaf0,options);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = 'r';
          goto LAB_00c7c3b8;
        }
        bVar14 = options->use_direct_tcparser_table;
        bVar16 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
        iVar29 = in_stack_fffffffffffffaf0->number_;
        if (bVar14 == false) {
          if (bVar16) {
            bVar14 = iVar29 < 0x10;
            cVar15 = 'l';
          }
          else {
            bVar14 = iVar29 < 0x10;
            cVar15 = 'j';
          }
        }
        else if (bVar16) {
          bVar14 = iVar29 < 0x10;
          cVar15 = 'p';
        }
        else {
          bVar14 = iVar29 < 0x10;
          cVar15 = 'n';
        }
        break;
      case '\f':
        CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
        if (CVar19 == kCord) {
LAB_00c7c606:
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = 'V';
        }
        else {
          CVar19 = FieldDescriptor::cpp_string_type(in_stack_fffffffffffffaf0);
          if ((CVar19 == kView) && (options->use_micro_string == true)) {
LAB_00c7c6f3:
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\\';
          }
          else {
            if (options->is_string_inlined == true) goto LAB_00c7c777;
            bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
LAB_00c7c82f:
            if (bVar14 == false) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = 'D';
            }
            else {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = 'F';
            }
          }
        }
        break;
      case '\x0e':
        bVar14 = anon_unknown_36::TreatEnumAsInt(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
          if (!bVar14) {
            bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
            goto LAB_00c7c3f3;
          }
          goto LAB_00c7c1ca;
        }
        enum_type = FieldDescriptor::enum_type(in_stack_fffffffffffffaf0);
        bVar14 = anon_unknown_36::GetEnumValidationRange(enum_type,&first,&last);
        if (!bVar14) {
          bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '0';
          }
          else {
            bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
            if (bVar14) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = '.';
            }
            else {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = ',';
            }
          }
          break;
        }
        iVar13 = first;
        if (1 < (uint)first || 0x7f < last) {
          bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '6';
          }
          else {
            bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
            if (bVar14) {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = '4';
            }
            else {
              bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
              cVar15 = '2';
            }
          }
          break;
        }
        info.aux_idx = (uint8_t)last;
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (iVar13 == 0) {
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '<';
            goto LAB_00c7c3b8;
          }
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = ':';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '8';
          }
          break;
        }
        if (!bVar14) {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '@';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '>';
          }
          break;
        }
        bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
        cVar15 = 'B';
LAB_00c7c3b8:
        TVar31 = cVar15 - bVar14;
        goto LAB_00c7c944;
      case '\x11':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '\x18';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x16';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x14';
          }
        }
        break;
      case '\x12':
        bVar14 = FieldDescriptor::is_packed(in_stack_fffffffffffffaf0);
        if (bVar14) {
          bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
          cVar15 = '\x1e';
        }
        else {
          bVar14 = FieldDescriptor::is_repeated(in_stack_fffffffffffffaf0);
          if (bVar14) {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x1c';
          }
          else {
            bVar14 = in_stack_fffffffffffffaf0->number_ < 0x10;
            cVar15 = '\x1a';
          }
        }
        break;
      default:
switchD_00c7c16c_default:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&first,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0xfa,"picked != TcParseFunction::kNone");
LAB_00c7cc54:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&first);
      }
      TVar31 = cVar15 - bVar14;
LAB_00c7c944:
      info.func = TVar31;
      info.presence_probability = options->presence_probability;
      pFVar23 = std::
                variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                ::emplace<1ul,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field>
                          (&this_03->data,&info);
      pFVar23->field = local_460;
      pFVar23->coded_tag = (uint16_t)uVar17;
      iVar29 = *(int *)((long)&pFVar7->hasbit_idx + lVar38);
      uVar24 = (uint8_t)iVar29;
      if (iVar29 < 0) {
        uVar24 = '?';
      }
      pFVar23->hasbit_idx = uVar24;
      uVar37 = uVar37 | (uint)(0.05 <= options->presence_probability) << ((byte)uVar18 & 0x1f);
    }
LAB_00c7c050:
    lVar38 = lVar38 + 0x18;
  }
  uVar30 = local_458;
  while (1 < uVar30) {
    uVar27 = uVar30 >> 1;
    uVar20 = uVar37 >> ((byte)uVar27 & 0x1f);
    if ((uVar20 & uVar37) != 0) break;
    pFVar33 = fast_fields;
    for (uVar30 = 0; uVar27 != uVar30; uVar30 = uVar30 + 1) {
      uVar34 = (int)uVar27 + (int)uVar30;
      pFVar35 = (pointer)(ulong)uVar34;
      if (((uVar37 >> (uVar34 & 0x1f) & 1) != 0) ||
         (*(__index_type *)
           ((long)&(pFVar33->data).
                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
           + 0x18) == '\0')) {
        uVar10 = *(undefined8 *)
                  &pFVar33[uVar27].data.
                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ;
        uVar11 = *(undefined8 *)
                  ((long)&pFVar33[uVar27].data.
                          super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  + 8);
        puVar4 = (undefined8 *)
                 ((long)&pFVar33[uVar27].data.
                         super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         .
                         super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 + 0x10);
        uVar12 = puVar4[1];
        *(undefined8 *)
         ((long)&(pFVar33->data).
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
         + 0x10) = *puVar4;
        *(undefined8 *)
         ((long)&(pFVar33->data).
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
         + 0x18) = uVar12;
        *(undefined8 *)
         &(pFVar33->data).
          super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
          .
          super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
          .
          super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
          .
          super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
          .
          super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
          .
          super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
             = uVar10;
        *(undefined8 *)
         ((long)&(pFVar33->data).
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
         + 8) = uVar11;
      }
      pFVar33 = pFVar33 + 1;
    }
    uVar37 = uVar37 | uVar20;
    uVar30 = uVar27;
  }
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
  ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo*>
            ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
              *)pvVar1,fast_fields,fast_fields + uVar30);
  if (uVar30 == 0) {
    uVar37 = 0x40;
  }
  else {
    lVar38 = 0x3f;
    if (uVar30 != 0) {
      for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
      }
    }
    uVar37 = (uint)lVar38 ^ 0x3f;
  }
  ordered_fields_00.len_._0_4_ = 0x3f - uVar37;
  this->table_size_log2 = (int)ordered_fields_00.len_;
  ordered_fields_00.ptr_ = ordered_fields_01.ptr_;
  ordered_fields_00.len_._4_4_ = 0;
  anon_unknown_36::MakeNumToEntryTable
            ((NumToEntryTable *)&info,(anon_unknown_36 *)message_options_00,ordered_fields_00);
  NumToEntryTable::operator=(local_450,(NumToEntryTable *)&info);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ::~vector((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             *)&info.field);
  info._0_8_ = ((long)(this->field_entries).
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->field_entries).
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  _first = ordered_fields_01.ptr_;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&info,(unsigned_long *)&first,
                           "field_entries.size() == ordered_fields.size()");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&info,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x407,failure_msg);
LAB_00c7cc25:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&info);
  }
  pFVar7 = (this->field_entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fields_00.len_ = (size_type)in_stack_fffffffffffffaf0;
  fields_00.ptr_ = in_stack_fffffffffffffae8;
  entries_00.len_ =
       ((long)(this->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7) / 0x18;
  entries_00.ptr_ = pFVar7;
  anon_unknown_36::GenerateFieldNames
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&info,local_478,entries_00,
             (MessageOptions *)pFVar35,fields_00);
  this_04 = &info;
LAB_00c7caf8:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->field_name_data,this_04);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_04);
  return;
}

Assistant:

TailCallTableInfo::TailCallTableInfo(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields) {
  fallback_function =
      // Map entries discard unknown data
      descriptor->options().map_entry()
          ? TcParseFunction::kDiscardEverythingFallback
      // Reflection and weak messages have the reflection fallback
      : !message_options.uses_codegen || HasWeakFields(descriptor)
          ? TcParseFunction::kReflectionFallback
      // Codegen messages have lite and non-lite version
      : message_options.is_lite ? TcParseFunction::kGenericFallbackLite
                                : TcParseFunction::kGenericFallback;

  if (descriptor->options().message_set_wire_format()) {
    ABSL_DCHECK(ordered_fields.empty());
    if (message_options.uses_codegen) {
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          message_options.is_lite
              ? TcParseFunction::kMessageSetWireFormatParseLoopLite
              : TcParseFunction::kMessageSetWireFormatParseLoop,
          0, 0}}};

      aux_entries = {{kSelfVerifyFunc}};
    } else {
      ABSL_DCHECK(!message_options.is_lite);
      // The message set parser loop only handles codegen because it hardcodes
      // the generated extension registry. For reflection, use the reflection
      // loop which can handle arbitrary message factories.
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          TcParseFunction::kReflectionParseLoop, 0, 0}}};
    }

    table_size_log2 = 0;
    num_to_entry_table = MakeNumToEntryTable(ordered_fields);
    field_name_data = GenerateFieldNames(descriptor, field_entries,
                                         message_options, ordered_fields);

    return;
  }

  ABSL_DCHECK(std::is_sorted(ordered_fields.begin(), ordered_fields.end(),
                             [](const auto& lhs, const auto& rhs) {
                               return lhs.field->number() < rhs.field->number();
                             }));
  // If this message has any inlined string fields, store the donation state
  // offset in the first auxiliary entry, which is kInlinedStringAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.is_string_inlined; })) {
    aux_entries.resize(kInlinedStringAuxIdx + 1);  // Allocate our slot
    aux_entries[kInlinedStringAuxIdx] = {kInlinedStringDonatedOffset};
  }

  // If this message is split, store the split pointer offset in the second
  // and third auxiliary entries, which are kSplitOffsetAuxIdx and
  // kSplitSizeAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.should_split; })) {
    static_assert(kSplitOffsetAuxIdx + 1 == kSplitSizeAuxIdx, "");
    aux_entries.resize(kSplitSizeAuxIdx + 1);  // Allocate our 2 slots
    aux_entries[kSplitOffsetAuxIdx] = {kSplitOffset};
    aux_entries[kSplitSizeAuxIdx] = {kSplitSizeof};
  }

  field_entries = BuildFieldEntries(descriptor, message_options, ordered_fields,
                                    aux_entries);

  auto end_group_tag = GetEndGroupTag(descriptor);

  FastFieldInfo fast_fields[TcParseTableBase::kMaxFastFields];
  // Bit mask for the fields that are "important". Unimportant fields might be
  // set but it's ok if we lose them from the fast table. For example, cold
  // fields.
  uint32_t important_fields = 0;
  static_assert(
      sizeof(important_fields) * 8 >= TcParseTableBase::kMaxFastFields, "");
  // The largest table we allow has the same number of entries as the
  // message has fields, rounded up to the next power of 2 (e.g., a message
  // with 5 fields can have a fast table of size 8). A larger table *might*
  // cover more fields in certain cases, but a larger table in that case
  // would have mostly empty entries; so, we cap the size to avoid
  // pathologically sparse tables.
  // However, if this message uses group encoding, the tables are sometimes very
  // sparse because the fields in the group avoid using the same field
  // numbering as the parent message (even though currently, the proto
  // compiler allows the overlap, and there is no possible conflict.)
  // NOTE: The +1 is to maintain the existing behavior that does not match the
  // documented one. When the number of fields is exactly a power of two we
  // allow double that.
  size_t num_fast_fields =
      FastParseTableSize(ordered_fields.size(), end_group_tag);
  PopulateFastFields(
      end_group_tag, field_entries, message_options, ordered_fields,
      absl::MakeSpan(fast_fields, num_fast_fields), important_fields);
  // If we can halve the table without dropping important fields, do it.
  while (num_fast_fields > 1 &&
         (important_fields & (important_fields >> num_fast_fields / 2)) == 0) {
    // Half the table by merging fields.
    num_fast_fields /= 2;
    for (size_t i = 0; i < num_fast_fields; ++i) {
      size_t merge_i = i + num_fast_fields;
      // Overwrite the surviving entries if the discarded half contains an
      // important field (meaning the surviving entry is not) or the surviving
      // entry is empty.
      if (((important_fields >> merge_i) & 1) != 0 ||
          fast_fields[i].is_empty()) {
        fast_fields[i] = fast_fields[merge_i];
      }
    }
    important_fields |= important_fields >> num_fast_fields;
  }

  fast_path_fields.assign(fast_fields, fast_fields + num_fast_fields);
  table_size_log2 = absl::bit_width(num_fast_fields) - 1;

  num_to_entry_table = MakeNumToEntryTable(ordered_fields);
  ABSL_CHECK_EQ(field_entries.size(), ordered_fields.size());
  field_name_data = GenerateFieldNames(descriptor, field_entries,
                                       message_options, ordered_fields);
}